

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Keyboard.cpp
# Opt level: O0

uint16_t * __thiscall
Enterprise::CharacterMapper::sequence_for_character(CharacterMapper *this,char character)

{
  uint16_t *puVar1;
  char character_local;
  CharacterMapper *this_local;
  
  puVar1 = Utility::CharacterMapper::table_lookup_sequence_for_character<unsigned_short[127][16]>
                     (&this->super_CharacterMapper,
                      (unsigned_short (*) [127] [16])sequence_for_character::key_sequences,character
                     );
  return puVar1;
}

Assistant:

const uint16_t *CharacterMapper::sequence_for_character(char character) const {
#define KEYS(x)		{uint16_t(x), MachineTypes::MappedKeyboardMachine::KeyEndSequence}
#define SHIFT(x)	{uint16_t(Key::LeftShift), uint16_t(x), MachineTypes::MappedKeyboardMachine::KeyEndSequence}
#define _			{MachineTypes::MappedKeyboardMachine::KeyNotMapped}
	static KeySequence key_sequences[] = {
		/* NUL */	_,							/* SOH */	_,
		/* STX */	_,							/* ETX */	_,
		/* EOT */	_,							/* ENQ */	_,
		/* ACK */	_,							/* BEL */	_,
		/* BS */	KEYS(Key::Erase),			/* HT */	KEYS(Key::Tab),
		/* LF */	KEYS(Key::Enter),			/* VT */	_,
		/* FF */	_,							/* CR */	KEYS(Key::Enter),
		/* SO */	_,							/* SI */	_,
		/* DLE */	_,							/* DC1 */	_,
		/* DC2 */	_,							/* DC3 */	_,
		/* DC4 */	_,							/* NAK */	_,
		/* SYN */	_,							/* ETB */	_,
		/* CAN */	_,							/* EM */	_,
		/* SUB */	_,							/* ESC */	KEYS(Key::Escape),
		/* FS */	_,							/* GS */	_,
		/* RS */	_,							/* US */	_,
		/* space */	KEYS(Key::Space),			/* ! */		SHIFT(Key::k1),
		/* " */		SHIFT(Key::k2),				/* # */		_,
		/* $ */		SHIFT(Key::k4),				/* % */		SHIFT(Key::k5),
		/* & */		SHIFT(Key::k6),				/* ' */		SHIFT(Key::k7),
		/* ( */		SHIFT(Key::k8),				/* ) */		SHIFT(Key::k9),
		/* * */		SHIFT(Key::Colon),			/* + */		SHIFT(Key::Semicolon),
		/* , */		KEYS(Key::Comma),			/* - */		KEYS(Key::Hyphen),
		/* . */		KEYS(Key::FullStop),		/* / */		KEYS(Key::ForwardSlash),
		/* 0 */		KEYS(Key::k0),				/* 1 */		KEYS(Key::k1),
		/* 2 */		KEYS(Key::k2),				/* 3 */		KEYS(Key::k3),
		/* 4 */		KEYS(Key::k4),				/* 5 */		KEYS(Key::k5),
		/* 6 */		KEYS(Key::k6),				/* 7 */		KEYS(Key::k7),
		/* 8 */		KEYS(Key::k8),				/* 9 */		KEYS(Key::k9),
		/* : */		KEYS(Key::Colon),			/* ; */		KEYS(Key::Semicolon),
		/* < */		SHIFT(Key::Comma),			/* = */		SHIFT(Key::Hyphen),
		/* > */		SHIFT(Key::FullStop),		/* ? */		SHIFT(Key::ForwardSlash),
		/* @ */		KEYS(Key::At),				/* A */		SHIFT(Key::A),
		/* B */		SHIFT(Key::B),				/* C */		SHIFT(Key::C),
		/* D */		SHIFT(Key::D),				/* E */		SHIFT(Key::E),
		/* F */		SHIFT(Key::F),				/* G */		SHIFT(Key::G),
		/* H */		SHIFT(Key::H),				/* I */		SHIFT(Key::I),
		/* J */		SHIFT(Key::J),				/* K */		SHIFT(Key::K),
		/* L */		SHIFT(Key::L),				/* M */		SHIFT(Key::M),
		/* N */		SHIFT(Key::N),				/* O */		SHIFT(Key::O),
		/* P */		SHIFT(Key::P),				/* Q */		SHIFT(Key::Q),
		/* R */		SHIFT(Key::R),				/* S */		SHIFT(Key::S),
		/* T */		SHIFT(Key::T),				/* U */		SHIFT(Key::U),
		/* V */		SHIFT(Key::V),				/* W */		SHIFT(Key::W),
		/* X */		SHIFT(Key::X),				/* Y */		SHIFT(Key::Y),
		/* Z */		SHIFT(Key::Z),				/* [ */		KEYS(Key::OpenSquareBracket),
		/* \ */		KEYS(Key::Backslash),		/* ] */		KEYS(Key::CloseSquareBracket),
		/* ^ */		SHIFT(Key::Caret),			/* _ */		SHIFT(Key::k0),
		/* ` */		SHIFT(Key::At),				/* a */		KEYS(Key::A),
		/* b */		KEYS(Key::B),				/* c */		KEYS(Key::C),
		/* d */		KEYS(Key::D),				/* e */		KEYS(Key::E),
		/* f */		KEYS(Key::F),				/* g */		KEYS(Key::G),
		/* h */		KEYS(Key::H),				/* i */		KEYS(Key::I),
		/* j */		KEYS(Key::J),				/* k */		KEYS(Key::K),
		/* l */		KEYS(Key::L),				/* m */		KEYS(Key::M),
		/* n */		KEYS(Key::N),				/* o */		KEYS(Key::O),
		/* p */		KEYS(Key::P),				/* q */		KEYS(Key::Q),
		/* r */		KEYS(Key::R),				/* s */		KEYS(Key::S),
		/* t */		KEYS(Key::T),				/* u */		KEYS(Key::U),
		/* v */		KEYS(Key::V),				/* w */		KEYS(Key::W),
		/* x */		KEYS(Key::X),				/* y */		KEYS(Key::Y),
		/* z */		KEYS(Key::Z),				/* { */		SHIFT(Key::OpenSquareBracket),
		/* | */		SHIFT(Key::Backslash),		/* } */		SHIFT(Key::CloseSquareBracket),
		/* ~ */		SHIFT(Key::Caret)
	};
#undef _
#undef SHIFT
#undef KEYS

	return table_lookup_sequence_for_character(key_sequences, character);
}